

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.cc
# Opt level: O2

void hexdump(FILE *fp,char *msg,void *in,size_t len)

{
  size_t i;
  size_t sVar1;
  
  fputs(msg,(FILE *)fp);
  for (sVar1 = 0; len != sVar1; sVar1 = sVar1 + 1) {
    fprintf((FILE *)fp,"%02x",(ulong)*(byte *)((long)in + sVar1));
  }
  fputs("\n",(FILE *)fp);
  return;
}

Assistant:

void hexdump(FILE *fp, const char *msg, const void *in, size_t len) {
  const uint8_t *data = reinterpret_cast<const uint8_t*>(in);

  fputs(msg, fp);
  for (size_t i = 0; i < len; i++) {
    fprintf(fp, "%02x", data[i]);
  }
  fputs("\n", fp);
}